

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

iterator __thiscall
boost::unordered::detail::foa::
table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
::begin(table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
        *this)

{
  uchar uVar1;
  uint uVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  iterator iVar9;
  iterator iVar10;
  
  iVar10.pc_ = ((this->
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL>_>
                ).arrays.groups_)->m;
  ppVar5 = (this->
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL>_>
           ).arrays.elements_;
  if ((ppVar5 != (value_type_pointer)0x0) &&
     (auVar7[0] = -((iVar10.pc_)->n == '\0'), auVar7._1_7_ = 0,
     auVar7[8] = -(iVar10.pc_[8].n == '\0'), auVar7[9] = -(iVar10.pc_[9].n == '\0'),
     auVar7[10] = -(iVar10.pc_[10].n == '\0'), auVar7[0xb] = -(iVar10.pc_[0xb].n == '\0'),
     auVar7[0xc] = -(iVar10.pc_[0xc].n == '\0'), auVar7[0xd] = -(iVar10.pc_[0xd].n == '\0'),
     auVar7[0xe] = -(iVar10.pc_[0xe].n == '\0'),
     auVar7[0xf] = -(*(char *)(iVar10.pc_ + 0xf) == '\0'),
     (auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    psVar3 = iVar10.pc_ + 2;
    psVar4 = iVar10.pc_;
    do {
      iVar10.pc_ = psVar3;
      ppVar5 = ppVar5 + 1;
      if (((uint)psVar4 & 0xf) == 0xe) goto LAB_0075bec0;
      uVar1 = ((group15<boost::unordered::detail::foa::plain_integral> *)(iVar10.pc_ + -1))->m[0].n;
      psVar4 = psVar4 + 1;
      psVar3 = iVar10.pc_ + 1;
    } while (uVar1 == '\0');
    iVar10.pc_ = iVar10.pc_ + -1;
    if (uVar1 == '\x01') {
      iVar10.p_ = (table_element_pointer)0x0;
      return iVar10;
    }
  }
LAB_0075beb6:
  iVar9.p_ = ppVar5;
  iVar9.pc_ = &(iVar10.pc_)->n;
  return iVar9;
LAB_0075bec0:
  do {
    auVar8[0] = -((iVar10.pc_)->n == '\0');
    auVar8[1] = -(iVar10.pc_[1].n == '\0');
    auVar8[2] = -(iVar10.pc_[2].n == '\0');
    auVar8[3] = -(iVar10.pc_[3].n == '\0');
    auVar8[4] = -(iVar10.pc_[4].n == '\0');
    auVar8[5] = -(iVar10.pc_[5].n == '\0');
    auVar8[6] = -(iVar10.pc_[6].n == '\0');
    auVar8[7] = -(iVar10.pc_[7].n == '\0');
    auVar8[8] = -(iVar10.pc_[8].n == '\0');
    auVar8[9] = -(iVar10.pc_[9].n == '\0');
    auVar8[10] = -(iVar10.pc_[10].n == '\0');
    auVar8[0xb] = -(iVar10.pc_[0xb].n == '\0');
    auVar8[0xc] = -(iVar10.pc_[0xc].n == '\0');
    auVar8[0xd] = -(iVar10.pc_[0xd].n == '\0');
    auVar8[0xe] = -(iVar10.pc_[0xe].n == '\0');
    auVar8[0xf] = -(*(char *)(iVar10.pc_ + 0xf) == '\0');
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe);
    if (uVar6 == 0x7fff) {
      iVar10.pc_ = iVar10.pc_ + 0x10;
      ppVar5 = ppVar5 + 0xf;
    }
    else {
      uVar2 = 0;
      if ((uVar6 ^ 0x7fff) != 0) {
        for (; ((uVar6 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (iVar10.pc_[uVar2].n == '\x01') {
        ppVar5 = (value_type_pointer)0x0;
      }
      else {
        iVar10.pc_ = iVar10.pc_ + uVar2;
        ppVar5 = (value_type_pointer)((long)&(ppVar5->first)._M_len + (ulong)(uVar2 << 5));
      }
    }
  } while (uVar6 == 0x7fff);
  goto LAB_0075beb6;
}

Assistant:

value_type* elements() const noexcept { return std::to_address(elements_); }